

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_xml.cpp
# Opt level: O2

ON__UINT32 __thiscall
ON_XMLNode::ReadFromStream
          (ON_XMLNode *this,wchar_t *stream,bool bWarningsAsErrors,bool bValidateTags)

{
  ON_XMLNodePrivate *this_00;
  bool bVar1;
  int iVar2;
  uint uVar3;
  wchar_t *pwVar4;
  undefined4 extraout_var;
  ON_XMLNode *this_01;
  ON_XMLProperty *this_02;
  undefined4 extraout_var_00;
  ON_XMLVariant *pOVar5;
  ON__UINT32 OVar6;
  ulong uVar7;
  ON_wString sDefaultProperty;
  ON_wString tag;
  wchar_t *local_148;
  wchar_t *local_140;
  ON_wString local_138;
  uint local_12c;
  ON_XMLVariant local_128;
  
  if (stream == (wchar_t *)0x0) {
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_xml.cpp"
               ,0xd8e,"","Stream cannot be null");
    OVar6 = 0xffffffff;
  }
  else {
    if (bWarningsAsErrors) {
      g_iWarningsFlagCounter = g_iWarningsFlagCounter + 1;
    }
    (*this->_vptr_ON_XMLNode[0x14])(this);
    local_148 = stream;
    ON_wString::ON_wString(&tag);
    bVar1 = ON_XMLNodePrivate::GetNextTag(&tag,&local_148,bValidateTags);
    OVar6 = 0xffffffff;
    if (bVar1) {
      bVar1 = ON_wString::IsEmpty(&tag);
      if (!bVar1) {
        this_00 = this->_private;
        this_00->m_last_read_buf_ptr = stream;
        ON_XMLNodePrivate::GetPropertiesFromTag(this_00,&tag);
        iVar2 = ON_wString::Length(&tag);
        pwVar4 = ON_wString::operator[](&tag,iVar2 + -2);
        if (*pwVar4 == L'/') {
LAB_0067f533:
          iVar2 = (*this->_vptr_ON_XMLNode[9])(this);
          (**(code **)(*(long *)CONCAT44(extraout_var,iVar2) + 200))
                    ((long *)CONCAT44(extraout_var,iVar2),this);
          uVar7 = (long)local_148 - (long)stream;
          for (pwVar4 = local_148; (*pwVar4 == L'\r' || (*pwVar4 == L'\n')); pwVar4 = pwVar4 + 1) {
            uVar7 = uVar7 + 4;
          }
          OVar6 = (ON__UINT32)(uVar7 >> 2);
        }
        else {
          ON_wString::ON_wString(&sDefaultProperty);
          local_12c = (uint)bWarningsAsErrors;
          while( true ) {
            iVar2 = 0;
            pwVar4 = local_148;
            while( true ) {
              local_140 = local_148;
              if (*pwVar4 == L'\0') goto LAB_0067f6a7;
              if (*pwVar4 == L'<') break;
              pwVar4 = pwVar4 + 1;
              iVar2 = iVar2 + 1;
            }
            ON_REMOVE_ASAP_AssertEx
                      (1,
                       "/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_xml.cpp"
                       ,0xdc2,"","*start == L\'<\' is false");
            if (*pwVar4 == L'<') {
              ON_wString::Append(&sDefaultProperty,local_140,iVar2);
            }
            local_148 = pwVar4;
            bVar1 = ON_XMLNodePrivate::GetNextTag(&tag,&local_148,bValidateTags);
            if (!bVar1) break;
            bVar1 = ON_XMLNodePrivate::IsClosingTag(this->_private,&tag);
            if (bVar1) {
              ON_wString::TrimLeft(&sDefaultProperty,(wchar_t *)0x0);
              ON_wString::TrimRight(&sDefaultProperty,(wchar_t *)0x0);
              DecodeXML(&sDefaultProperty);
              bVar1 = ON_wString::IsEmpty(&sDefaultProperty);
              if (!bVar1) {
                this_02 = (ON_XMLProperty *)operator_new(0x68);
                ON_XMLProperty::ON_XMLProperty(this_02);
                (*this->_vptr_ON_XMLNode[0xc])(this,this_02);
                if (ON_XMLNodePrivate::m_bAutoTypePropValue == true) {
                  iVar2 = ON_wString::Find(&sDefaultProperty,L":");
                  if (0 < iVar2) {
                    iVar2 = (*this_02->_vptr_ON_XMLProperty[9])(this_02);
                    pOVar5 = (ON_XMLVariant *)CONCAT44(extraout_var_00,iVar2);
                    ON_wString::Mid(&local_138,(int)&sDefaultProperty);
                    ::ON_XMLVariant::ON_XMLVariant(&local_128,&local_138);
                    ::ON_XMLVariant::operator=(pOVar5,&local_128);
                    ::ON_XMLVariant::~ON_XMLVariant(&local_128);
                    ON_wString::~ON_wString(&local_138);
                    (*pOVar5->_vptr_ON_XMLVariant[0x2f])(pOVar5,1);
                    goto LAB_0067f7e2;
                  }
                }
                ON_XMLPropertyPrivate::SetHugeStringValue(this_02->_private,&sDefaultProperty);
                pOVar5 = ON_XMLPropertyPrivate::GetNonConstValue(this_02->_private);
                (*pOVar5->_vptr_ON_XMLVariant[0x2f])(pOVar5,1);
              }
LAB_0067f7e2:
              ON_wString::~ON_wString(&sDefaultProperty);
              goto LAB_0067f533;
            }
            this_01 = (ON_XMLNode *)operator_new(0xe8);
            pwVar4 = local_140;
            ON_XMLNode(this_01,L"");
            (*this->_vptr_ON_XMLNode[0xb])(this,this_01);
            uVar3 = (*this_01->_vptr_ON_XMLNode[0x17])
                              (this_01,pwVar4,(ulong)local_12c,bValidateTags);
            if (uVar3 == 0xffffffff) break;
            local_148 = local_140 + uVar3;
          }
LAB_0067f6a7:
          ON_wString::~ON_wString(&sDefaultProperty);
        }
      }
    }
    ON_wString::~ON_wString(&tag);
    if (bWarningsAsErrors) {
      g_iWarningsFlagCounter = g_iWarningsFlagCounter + -1;
    }
  }
  return OVar6;
}

Assistant:

ON__UINT32 ON_XMLNode::ReadFromStream(const wchar_t* stream, bool bWarningsAsErrors, bool bValidateTags)
{
  if (nullptr == stream)
  {
    ON_ERROR("Stream cannot be null");
    return ReadError;
  }

  CWarningHelper wh(bWarningsAsErrors);

  Clear();

  // Search for the opening tag "<" character.
  wchar_t* pBuffer = const_cast<wchar_t*>(stream);

  ON_wString tag;

  // 1st August 2022 John Croudy, https://mcneel.myjetbrains.com/youtrack/issue/RH-66795
  // The original code was not checking GetNextTag() for failure and blindly continuing with an empty tag.
  // Then in some places it assumed that the tag was not empty. This is confusing because I thought
  // this was causing RH-66795, but it couldn't be because this bug was not in 7.x, and RH-66795 is 7.13.
  if (!_private->GetNextTag(tag, pBuffer, bValidateTags))
    return ReadError;

  if (tag.IsEmpty())
    return ReadError;

  _private->m_last_read_buf_ptr = (void*)stream;

  _private->GetPropertiesFromTag(tag);

  const auto pos1 = tag.Length() - 2; // Assumes the tag is not empty.
  if (tag[pos1] != L'/')
  {
    // This tag either has children, or a default property.
    ON_wString sDefaultProperty;

    bool bClosingTag = false;
    do
    {
      auto* pStoreBuffer = pBuffer;

      // Get anything between the tags and store as the default parameter.
      auto* start = pBuffer;
      while ((*start != L'<') && (*start != 0))
      {
        start++;
      }

      if (0 == *start)
      {
        // We ran off the end of the buffer - no idea why, but this is bad, so fail.
        // See http://mcneel.myjetbrains.com/youtrack/issue/RH-16605 for example.
        return ReadError;
      }

      ON_ASSERT(*start == L'<');

      if (nullptr != start && *start == L'<')
      {
        sDefaultProperty.Append(pBuffer, (int)(start - pBuffer));
      }

      pBuffer = start;

      // 1st August 2022 John Croudy, https://mcneel.myjetbrains.com/youtrack/issue/RH-66795
      // The original code was not checking GetNextTag() for failure and blindly continuing with
      // an empty tag. This caused continuous child recursion because the buffer pointer was
      // still pointing at the same (bad) XML. This is confusing because I thought this was causing
      // RH-66795, but it couldn't be because this bug was not in 7.x, and RH-66795 is 7.13.
      if (!_private->GetNextTag(tag, pBuffer, bValidateTags))
        return ReadError;

      bClosingTag = _private->IsClosingTag(tag);

      if (!bClosingTag)
      {
        auto* pNode = new ON_XMLNode(L"");
        AttachChildNode(pNode);

        const auto read = pNode->ReadFromStream(pStoreBuffer, bWarningsAsErrors, bValidateTags);
        if (ReadError == read)
          return ReadError;

        pBuffer = pStoreBuffer + read;
      }
    }
    while (!bClosingTag);

    sDefaultProperty.TrimLeft();
    sDefaultProperty.TrimRight();
    DecodeXML(sDefaultProperty);

    if (!sDefaultProperty.IsEmpty())
    {
      auto* pProp = new ON_XMLProperty;
      AttachProperty(pProp);

      const int pos2 = ON_XMLNodePrivate::m_bAutoTypePropValue ? sDefaultProperty.Find(L":") : -1;
      if (pos2 > 0)
      {
        auto& v = pProp->GetNonConstValue();
        v = sDefaultProperty.Mid(pos2 + 1);
        v.SetTypePendingFlag(true);
      }
      else
      {
        pProp->_private->SetHugeStringValue(sDefaultProperty);
        pProp->_private->GetNonConstValue().SetTypePendingFlag(true);
      }
    }
  }

  TopLevel().OnNodeReadFromStream(this);

  while ((*pBuffer == L'\r') || (*pBuffer == L'\n'))
    pBuffer++;

  return ON__UINT32(pBuffer - stream);
}